

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.h
# Opt level: O2

search_site_config *
av1_get_search_site_config(AV1_COMP *cpi,MACROBLOCK *x,SEARCH_METHODS search_method)

{
  int iVar1;
  search_site_config *psVar2;
  
  iVar1 = (x->e_mbd).plane[0].pre[0].stride;
  if (iVar1 == (cpi->mv_search_params).search_site_cfg[0][0].stride) {
    psVar2 = (cpi->mv_search_params).search_site_cfg[0];
  }
  else if (iVar1 == (cpi->mv_search_params).search_site_cfg[1][0].stride) {
    psVar2 = (cpi->mv_search_params).search_site_cfg[1];
  }
  else {
    psVar2 = x->search_site_cfg_buf;
    if (iVar1 != x->search_site_cfg_buf[""[search_method]].stride) {
      (*av1_init_motion_compensation[""[""[search_method]]])
                (psVar2 + ""[""[search_method]],iVar1,SUB14((search_method & 0xfe) == 2,0));
    }
  }
  return psVar2;
}

Assistant:

static inline const search_site_config *av1_get_search_site_config(
    const AV1_COMP *cpi, MACROBLOCK *x, SEARCH_METHODS search_method) {
  const int ref_stride = x->e_mbd.plane[0].pre[0].stride;

  // AV1_COMP::mv_search_params.search_site_config is a compressor level cache
  // that's shared by multiple threads. In most cases where all frames have the
  // same resolution, the cache contains the search site config that we need.
  const MotionVectorSearchParams *mv_search_params = &cpi->mv_search_params;
  if (ref_stride == mv_search_params->search_site_cfg[SS_CFG_SRC]->stride) {
    return mv_search_params->search_site_cfg[SS_CFG_SRC];
  } else if (ref_stride ==
             mv_search_params->search_site_cfg[SS_CFG_LOOKAHEAD]->stride) {
    return mv_search_params->search_site_cfg[SS_CFG_LOOKAHEAD];
  }

  // If the cache does not contain the correct stride, then we will need to rely
  // on the thread level config MACROBLOCK::search_site_cfg_buf. If even the
  // thread level config doesn't match, then we need to update it.
  search_method = search_method_lookup[search_method];
  assert(search_method_lookup[search_method] == search_method &&
         "The search_method_lookup table should be idempotent.");
  if (ref_stride != x->search_site_cfg_buf[search_method].stride) {
    av1_refresh_search_site_config(x->search_site_cfg_buf, search_method,
                                   ref_stride);
  }

  return x->search_site_cfg_buf;
}